

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptGeneratorFunction * __thiscall
Js::JavascriptLibrary::CreateGeneratorFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,bool isAnonymousFunction)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicType *type;
  Recycler *recycler;
  JavascriptGeneratorFunction *this_00;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (((((this->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
      m_ES6Generators == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x19b6,"(scriptContext->GetConfig()->IsES6GeneratorsEnabled())",
                                "scriptContext->GetConfig()->IsES6GeneratorsEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  type = CreateDeferredPrototypeGeneratorFunctionType(this,entryPoint,isAnonymousFunction,false);
  local_58 = (undefined1  [8])&JavascriptGeneratorFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x19ba;
  recycler = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
  this_00 = (JavascriptGeneratorFunction *)
            new<(Memory::ObjectInfoBits)1>
                      (0x38,recycler,(InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27)
  ;
  JavascriptGeneratorFunction::JavascriptGeneratorFunction
            (this_00,type,(GeneratorVirtualScriptFunction *)0x0);
  return this_00;
}

Assistant:

JavascriptGeneratorFunction* JavascriptLibrary::CreateGeneratorFunction(JavascriptMethod entryPoint, bool isAnonymousFunction)
    {
        Assert(scriptContext->GetConfig()->IsES6GeneratorsEnabled());

        DynamicType* type = CreateDeferredPrototypeGeneratorFunctionType(entryPoint, isAnonymousFunction);

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptGeneratorFunction, type, nullptr);
    }